

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O2

void __thiscall ON_Matrix::Destroy(ON_Matrix *this)

{
  void *pvVar1;
  void *memblock;
  
  this->m = (double **)0x0;
  this->m_row_count = 0;
  this->m_col_count = 0;
  if (-1 < (this->m_rowmem).m_capacity) {
    (this->m_rowmem).m_count = 0;
  }
  if (this->m_Mmem != (double **)0x0) {
    onfree(this->m_Mmem);
    this->m_Mmem = (double **)0x0;
  }
  memblock = this->m_cmem;
  this->m_row_offset = 0;
  this->m_col_offset = 0;
  this->m_cmem = (void *)0x0;
  while (memblock != (void *)0x0) {
    pvVar1 = *(void **)((long)memblock + 0x10);
    onfree(memblock);
    memblock = pvVar1;
  }
  return;
}

Assistant:

void ON_Matrix::Destroy()
{
  m = 0;
  m_row_count = 0;
  m_col_count = 0;
  m_rowmem.SetCount(0);
  if ( 0 != m_Mmem )
  {
    // pointer passed to Create( row_count, col_count, M, bDestructorFreeM )
    // when bDestructorFreeM = true.
    onfree(m_Mmem);
    m_Mmem = 0;
  }
	m_row_offset = 0;
	m_col_offset = 0;
  struct DBLBLK* cmem = (struct DBLBLK*)m_cmem;
  m_cmem = 0;
  while( 0 != cmem )
  {
    struct DBLBLK* next_cmem = cmem->next;
    onfree(cmem);
    cmem = next_cmem;
  }
}